

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,size_t length,bool emitUTF8)

{
  Json *pJVar1;
  Json JVar2;
  pointer pcVar3;
  undefined8 uVar4;
  Json *pJVar5;
  String *extraout_RAX;
  String *pSVar6;
  long *plVar7;
  String *extraout_RAX_00;
  String *extraout_RAX_01;
  Json *pJVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint ch;
  char local_7c;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX;
  }
  pJVar1 = this + (long)value;
  pJVar5 = this;
  if (0 < (long)value >> 2) {
    lVar11 = ((long)value >> 2) + 1;
    pJVar8 = this + 3;
    do {
      pJVar5 = pJVar8;
      JVar2 = pJVar5[-3];
      if (((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) || (JVar2 == (Json)0x5c)) ||
         ((char)JVar2 < '\0')) {
        pJVar5 = pJVar5 + -3;
        goto LAB_007fefe5;
      }
      JVar2 = pJVar5[-2];
      if ((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) ||
         ((JVar2 == (Json)0x5c || ((char)JVar2 < '\0')))) {
        pJVar5 = pJVar5 + -2;
        goto LAB_007fefe5;
      }
      JVar2 = pJVar5[-1];
      if ((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) ||
         ((JVar2 == (Json)0x5c || ((char)JVar2 < '\0')))) {
        pJVar5 = pJVar5 + -1;
        goto LAB_007fefe5;
      }
      JVar2 = *pJVar5;
      if (((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) || (JVar2 == (Json)0x5c)) ||
         ((char)JVar2 < '\0')) goto LAB_007fefe5;
      lVar11 = lVar11 + -1;
      pJVar8 = pJVar5 + 4;
      pJVar5 = this + ((ulong)value & 0xfffffffffffffffc);
    } while (1 < lVar11);
  }
  lVar11 = (long)pJVar1 - (long)pJVar5;
  if (lVar11 == 1) {
LAB_007fef90:
    JVar2 = *pJVar5;
    if ((((0x1f < (byte)JVar2) && (JVar2 != (Json)0x22)) && (JVar2 != (Json)0x5c)) &&
       (-1 < (char)JVar2)) goto LAB_007ff277;
  }
  else if (lVar11 == 2) {
LAB_007fef77:
    JVar2 = *pJVar5;
    if (((0x1f < (byte)JVar2) && (JVar2 != (Json)0x22)) &&
       ((JVar2 != (Json)0x5c && (-1 < (char)JVar2)))) {
      pJVar5 = pJVar5 + 1;
      goto LAB_007fef90;
    }
  }
  else {
    if (lVar11 != 3) goto LAB_007ff277;
    JVar2 = *pJVar5;
    if (((0x1f < (byte)JVar2) && (JVar2 != (Json)0x22)) &&
       ((JVar2 != (Json)0x5c && (-1 < (char)JVar2)))) {
      pJVar5 = pJVar5 + 1;
      goto LAB_007fef77;
    }
  }
LAB_007fefe5:
  if (pJVar5 != pJVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (value != (char *)0x0) {
      do {
        JVar2 = *this;
        ch = (uint)(byte)JVar2;
        pJVar5 = this;
        switch(JVar2) {
        case (Json)0x8:
          break;
        case (Json)0x9:
          break;
        case (Json)0xa:
          break;
        case (Json)0xb:
switchD_007ff051_caseD_b:
          local_7c = (char)length;
          uVar12 = (uint)(byte)JVar2;
          if (local_7c == '\0') {
            if ((char)JVar2 < '\0') {
              if ((byte)JVar2 < 0xe0) {
                ch = 0xfffd;
                if (1 < (long)pJVar1 - (long)this) {
                  uVar12 = (uVar12 & 0x1f) << 6;
                  pJVar5 = this + 1;
                  if (0x7f < uVar12) {
                    ch = uVar12 | (byte)this[1] & 0x3f;
                    goto LAB_007ff0ce;
                  }
                }
              }
              else if ((byte)JVar2 < 0xf0) {
                ch = 0xfffd;
                if (2 < (long)pJVar1 - (long)this) {
                  uVar12 = ((byte)JVar2 & 0xf) << 0xc;
                  uVar13 = ((byte)this[1] & 0x3f) << 6 | uVar12;
                  pJVar5 = this + 2;
                  if (((0xdfff < uVar12) || (uVar13 < 0xd800)) && (0x7ff < uVar13)) {
                    ch = uVar13 | (byte)*pJVar5 & 0x3f;
                    goto LAB_007ff0ce;
                  }
                }
              }
              else {
                ch = 0xfffd;
                if (3 < (long)pJVar1 - (long)this && (byte)JVar2 < 0xf8) {
                  uVar12 = ((byte)this[1] & 0x3f) << 0xc | (uVar12 & 7) << 0x12;
                  pJVar5 = this + 3;
                  if (0xffff < uVar12) {
                    ch = (byte)this[3] & 0x3f | ((byte)this[2] & 0x3f) << 6 | uVar12;
                    goto LAB_007ff0ce;
                  }
                }
              }
LAB_007ff1f0:
              appendHex(__return_storage_ptr__,ch);
            }
            else {
LAB_007ff0ce:
              if (0x1f < ch) {
                if (ch < 0x80) {
                  std::__cxx11::string::push_back((char)__return_storage_ptr__);
                  goto LAB_007ff0b8;
                }
                if (ch < 0x10000) goto LAB_007ff1f0;
                appendHex(__return_storage_ptr__,ch + 0xf0000 >> 10 & 0x3ff | 0xd800);
                ch = ch & 0x3ff | 0xdc00;
              }
              appendHex(__return_storage_ptr__,ch);
            }
          }
          else if ((byte)JVar2 < 0x20) {
            appendHex(__return_storage_ptr__,uVar12);
          }
          else {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
          goto LAB_007ff0b8;
        case (Json)0xc:
          break;
        case (Json)0xd:
          break;
        default:
          if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_007ff051_caseD_b;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_007ff0b8:
        this = pJVar5 + 1;
      } while (this != pJVar1);
    }
    pSVar6 = (String *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    return pSVar6;
  }
LAB_007ff277:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\"","");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pSVar6 = (String *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pSVar6->_M_dataplus)._M_p;
  paVar10 = &pSVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar10) {
    uVar4 = *(undefined8 *)((long)&pSVar6->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pSVar6->_M_string_length;
  (pSVar6->_M_dataplus)._M_p = (pointer)paVar10;
  pSVar6->_M_string_length = 0;
  (pSVar6->field_2)._M_local_buf[0] = '\0';
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
    pSVar6 = extraout_RAX_00;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    pSVar6 = extraout_RAX_01;
  }
  return pSVar6;
}

Assistant:

static String valueToQuotedStringN(const char* value, size_t length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!doesAnyCharRequireEscaping(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        unsigned codepoint = static_cast<unsigned char>(*c);
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else {
          appendRaw(result, codepoint);
        }
      } else {
        unsigned codepoint = utf8ToCodepoint(c, end); // modifies `c`
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else if (codepoint < 0x80) {
          appendRaw(result, codepoint);
        } else if (codepoint < 0x10000) {
          // Basic Multilingual Plane
          appendHex(result, codepoint);
        } else {
          // Extended Unicode. Encode 20 bits as a surrogate pair.
          codepoint -= 0x10000;
          appendHex(result, 0xd800 + ((codepoint >> 10) & 0x3ff));
          appendHex(result, 0xdc00 + (codepoint & 0x3ff));
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}